

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertUTFWrapper.cpp
# Opt level: O0

bool llvm::ConvertUTF8toWide(char *Source,wstring *Result)

{
  StringRef Source_00;
  wstring *local_50;
  llvm *local_40 [2];
  wstring *local_30;
  wstring *Result_local;
  char *Source_local;
  char *local_18;
  llvm **local_10;
  
  local_30 = Result;
  Result_local = (wstring *)Source;
  if (Source == (char *)0x0) {
    std::__cxx11::wstring::clear();
    Source_local._7_1_ = true;
  }
  else {
    local_10 = local_40;
    local_40[0] = (llvm *)Source;
    local_18 = Source;
    if (Source == (char *)0x0) {
      local_50 = (wstring *)0x0;
    }
    else {
      local_50 = (wstring *)strlen(Source);
    }
    Source_00.Length = (size_t)local_30;
    Source_00.Data = (char *)local_50;
    Source_local._7_1_ = ConvertUTF8toWide(local_40[0],Source_00,local_50);
  }
  return Source_local._7_1_;
}

Assistant:

bool ConvertUTF8toWide(const char *Source, std::wstring &Result) {
  if (!Source) {
    Result.clear();
    return true;
  }
  return ConvertUTF8toWide(llvm::StringRef(Source), Result);
}